

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

void SetupUnitTestArgs(ArgsManager *argsman)

{
  long lVar1;
  path *in_RDI;
  long in_FS_OFFSET;
  path *in_stack_fffffffffffffe68;
  path *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  allocator<char> *in_stack_fffffffffffffea8;
  path *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  OptionsCategory *in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef4;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  ArgsManager *in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::filesystem::temp_directory_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffeb0,(char **)in_stack_fffffffffffffea8,
             (format)SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
  std::filesystem::__cxx11::operator/
            ((path *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_RDI);
  std::filesystem::__cxx11::path::path<char[1],std::filesystem::__cxx11::path>
            (in_stack_fffffffffffffeb0,(char (*) [1])in_stack_fffffffffffffea8,
             (format)SUB41((uint)in_stack_fffffffffffffea4 >> 0x18,0));
  std::filesystem::__cxx11::operator/
            ((path *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_RDI);
  fs::path::path((path *)in_stack_fffffffffffffe68,(path *)0xea66dd);
  fs::PathToString_abi_cxx11_(in_stack_fffffffffffffe70);
  tinyformat::format<std::__cxx11::string>((char *)in_RDI,in_stack_fffffffffffffe90);
  ArgsManager::AddArg(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                      in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe68->_M_pathname);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe68->_M_pathname);
  fs::path::~path((path *)in_stack_fffffffffffffe68);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe68);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe68);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe68);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe68);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe68);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe68->_M_pathname);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SetupUnitTestArgs(ArgsManager& argsman)
{
    argsman.AddArg("-testdatadir", strprintf("Custom data directory (default: %s<random_string>)", fs::PathToString(fs::temp_directory_path() / TEST_DIR_PATH_ELEMENT / "")),
                   ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
}